

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* __thiscall
mesh::createmat(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *__return_storage_ptr__,mesh *this,int m,int r,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *mcurrent,
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *res,int c)

{
  float fVar1;
  int iVar2;
  int iVar3;
  pointer pvVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  pointer pvVar11;
  undefined4 in_register_00000014;
  long lVar12;
  pointer pvVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  vector<float,_std::allocator<float>_> *row;
  allocator_type local_91;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_90;
  value_type_conflict2 local_84;
  ulong local_80;
  long local_78;
  long local_70;
  size_type local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_58;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_50;
  
  local_80 = CONCAT44(in_register_00000014,m);
  local_60 = (size_type)m;
  local_58 = mcurrent;
  local_50 = res;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(__return_storage_ptr__,local_60,&local_91);
  pvVar13 = (__return_storage_ptr__->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_90 = __return_storage_ptr__;
  for (pvVar11 = (__return_storage_ptr__->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pvVar11 != pvVar13;
      pvVar11 = pvVar11 + 1) {
    local_84 = 0.0;
    std::vector<float,_std::allocator<float>_>::resize(pvVar11,local_60,&local_84);
  }
  uVar15 = 0;
  if (0 < r) {
    uVar15 = (ulong)(uint)r;
  }
  iVar2 = r + 1;
  for (iVar8 = 1; iVar8 < c + -1; iVar8 = iVar8 + iVar2) {
    for (uVar19 = 0; uVar19 != uVar15; uVar19 = uVar19 + 1) {
      pvVar4 = (local_58->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar11 = (local_50->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar13 = (local_90->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      for (uVar21 = 0; (uint)r != uVar21; uVar21 = uVar21 + 1) {
        if (*(int *)(*(long *)&pvVar4[uVar19].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + (long)iVar8 * 4 + uVar21 * 4) == 1) {
          fVar1 = *(float *)(*(long *)&pvVar11[uVar19].
                                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                       super__Vector_impl_data + uVar21 * 4);
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            lVar7 = (long)(iVar8 / r);
            lVar9 = *(long *)&pvVar13[lVar7].super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data;
            *(float *)(lVar9 + lVar7 * 4) = fVar1 + *(float *)(lVar9 + lVar7 * 4);
          }
        }
      }
    }
  }
  iVar6 = (int)local_80;
  iVar8 = 1;
  iVar16 = 1;
  if (1 < iVar6) {
    iVar16 = iVar6;
  }
  local_78 = (long)iVar2 * 4 + 4;
  lVar9 = (long)iVar2 * 4;
  local_70 = 4;
  for (uVar19 = 0; uVar19 != iVar16 - 1; uVar19 = uVar19 + 1) {
    lVar7 = local_78;
    for (lVar20 = (long)iVar8; lVar20 < (long)local_60; lVar20 = lVar20 + 1) {
      lVar12 = local_70;
      lVar17 = lVar7;
      for (uVar21 = 0; uVar21 != uVar15; uVar21 = uVar21 + 1) {
        pvVar4 = (local_58->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar11 = (local_50->
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pvVar13 = (local_90->
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar14 = lVar17;
        lVar18 = lVar12;
        for (uVar10 = uVar21; (uint)r != uVar10; uVar10 = uVar10 + 1) {
          lVar5 = *(long *)&pvVar4[uVar21].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
          iVar2 = *(int *)(lVar5 + lVar18);
          if ((iVar2 != 0) && (iVar3 = *(int *)(lVar5 + lVar14), iVar3 != 0)) {
            lVar5 = *(long *)&pvVar13[uVar19].super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data;
            *(float *)(lVar5 + lVar20 * 4) =
                 (float)(iVar3 * iVar2) *
                 *(float *)(*(long *)&pvVar11[uVar21].
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data + uVar10 * 4) +
                 *(float *)(lVar5 + lVar20 * 4);
          }
          lVar14 = lVar14 + 4;
          lVar18 = lVar18 + 4;
        }
        lVar17 = lVar17 + 4;
        lVar12 = lVar12 + 4;
      }
      lVar7 = lVar7 + lVar9;
    }
    iVar8 = iVar8 + 1;
    local_78 = local_78 + lVar9;
    local_70 = local_70 + lVar9;
  }
  uVar19 = 0;
  uVar15 = local_80 & 0xffffffff;
  if (iVar6 < 1) {
    uVar15 = uVar19;
  }
  for (; uVar19 != uVar15; uVar19 = uVar19 + 1) {
    pvVar11 = (local_90->
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar13 = pvVar11 + uVar19;
    for (uVar21 = 0; uVar19 != uVar21; uVar21 = uVar21 + 1) {
      *(undefined4 *)
       (*(long *)&(pvVar13->super__Vector_base<float,_std::allocator<float>_>)._M_impl + uVar21 * 4)
           = *(undefined4 *)
              (*(long *)&(pvVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data + uVar19 * 4);
      pvVar11 = pvVar11 + 1;
    }
  }
  return local_90;
}

Assistant:

std::vector<std::vector<float>> createmat(int m, int r, std::vector<std::vector<int>> &mcurrent, std::vector<std::vector<float>> &res, int c)
    {

        int  k, kk, ii, jj, i, j;
        std::vector<std::vector<float>> a(m);
        for (auto &row : a)
        {
            row.resize(m, 0);
        }

        //element on the diagonal
        for(k=1; k<c-1; k=k+r+1)
        {
            for(i=0; i < r; i++)
            {
                for(j=0; j < r; j++)
                {
                    if(mcurrent[i][j+k]==1 && res[i][j]!=0)
                    {
                        a[k/r][k/r] += res[i][j];
                    }
                }
            }
        }

        //element off the diagonal
        for(i=0; i < m-1; i++) {
            for (j = i + 1; j < m; j++) {
                k = 1 + (r + 1) * i;
                kk = 1 + (r + 1) * j;
                for (ii = 0; ii < r; ii++) {
                    for (jj = ii; jj < r; jj++) {
                        if (mcurrent[ii][jj + k] != 0 && mcurrent[ii][jj + kk] != 0) {
                            a[i][j] += (mcurrent[ii][jj + k] * mcurrent[ii][jj + kk]) * res[ii][jj];
                        }
                    }
                }
            }
        }

            for(i = 0; i < m; i++)
            {
                for(j = 0; j < i; j++)
                {
                    a[i][j] = a[j][i];
                }
            }
             return a;
    }